

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>::val
          (FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>
           *this)

{
  FadCst<double> *in_RSI;
  Fad<double> *in_RDI;
  Fad<double> *this_00;
  Fad<double> *in_stack_ffffffffffffffc0;
  FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_> *in_stack_ffffffffffffffc8;
  Fad<double> *in_stack_ffffffffffffffd0;
  
  this_00 = in_RDI;
  FadCst<double>::val(in_RSI);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::val
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)in_RDI);
  operator/<double,_Fad<double>,_nullptr>
            ((double)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  Fad<double>::Fad<FadBinaryDiv<FadCst<double>,Fad<double>>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_> *)this_00);
  Fad<double>::~Fad(this_00);
  return this_00;
}

Assistant:

const value_type val() const {return left_.val() / right_.val();}